

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void garray_vis_msg(_garray *x,t_floatarg fvis)

{
  t_template *x_00;
  t_symbol *ptVar1;
  t_float tVar2;
  t_template *scalartemplate;
  int vis;
  int viswas;
  t_floatarg fvis_local;
  _garray *x_local;
  
  x_00 = template_findbyname(x->x_scalar->sc_template);
  if (x_00 == (t_template *)0x0) {
    pd_error((void *)0x0,"array: no template of type %s",x->x_scalar->sc_template->s_name);
  }
  else {
    ptVar1 = gensym("v");
    tVar2 = template_getfloat(x_00,ptVar1,x->x_scalar->sc_vec,1);
    if ((uint)(fvis != 0.0) != (int)tVar2) {
      ptVar1 = gensym("v");
      template_setfloat(x_00,ptVar1,x->x_scalar->sc_vec,(float)(fvis != 0.0),0);
      garray_redraw(x);
    }
  }
  return;
}

Assistant:

static void garray_vis_msg(t_garray *x, t_floatarg fvis)
{
    int viswas, vis = fvis != 0;
    t_template *scalartemplate;
    if (!(scalartemplate = template_findbyname(x->x_scalar->sc_template)))
    {
        pd_error(0, "array: no template of type %s",
            x->x_scalar->sc_template->s_name);
        return;
    }
    viswas = template_getfloat(
        scalartemplate, gensym("v"), x->x_scalar->sc_vec, 1);
    if (vis != viswas)
    {
        template_setfloat(scalartemplate, gensym("v"),
            x->x_scalar->sc_vec, vis, 0);
        garray_redraw(x);
    }
}